

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_is_full(container_t *c,uint8_t typecode)

{
  _Bool _Var1;
  run_container_t *run;
  uint8_t local_9;
  
  local_9 = typecode;
  run = (run_container_t *)container_unwrap_shared(c,&local_9);
  if (local_9 == '\x03') {
    _Var1 = run_container_is_full(run);
    return _Var1;
  }
  if ((local_9 != '\x02') && (local_9 != '\x01')) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
  }
  return run->n_runs == 0x10000;
}

Assistant:

static inline bool container_is_full(const container_t *c, uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_cardinality(
                       const_CAST_bitset(c)) == (1 << 16);
        case ARRAY_CONTAINER_TYPE:
            return array_container_cardinality(
                       const_CAST_array(c)) == (1 << 16);
        case RUN_CONTAINER_TYPE:
            return run_container_is_full(const_CAST_run(c));
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}